

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

void __thiscall wasm::Wasm2JSGlue::emitPostES6(Wasm2JSGlue *this)

{
  ExternalKind EVar1;
  Module *this_00;
  bool bVar2;
  reference pvVar3;
  pointer pMVar4;
  ostream *poVar5;
  basic_ostream<char,_std::char_traits<char>_> *pbVar6;
  reference this_01;
  pointer pEVar7;
  Module *wasm;
  anon_class_16_2_e1047309 visitor;
  anon_class_16_2_e1047309 visitor_00;
  Name name;
  string local_308;
  string local_2e8 [32];
  ostream *local_2c8;
  char *pcStack_2c0;
  string local_2b8;
  string local_298 [39];
  char local_271;
  const_iterator pvStack_270;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string_view *__range2;
  ostringstream export_name;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *exp;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range1;
  undefined1 local_80 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  seenModules;
  Wasm2JSGlue *this_local;
  
  bVar2 = std::
          vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
          ::empty(&this->wasm->memories);
  if (!bVar2) {
    pvVar3 = std::
             vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ::operator[](&this->wasm->memories,0);
    pMVar4 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar3);
    bVar2 = Importable::imported(&pMVar4->super_Importable);
    if (bVar2) {
      poVar5 = Output::operator<<(this->out,(char (*) [8])"var mem");
      pbVar6 = std::operator<<(poVar5,(this->moduleName).super_IString.str);
      poVar5 = std::operator<<(pbVar6," = new ArrayBuffer(");
      pvVar3 = std::
               vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ::operator[](&this->wasm->memories,0);
      pMVar4 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar3)
      ;
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(pMVar4->initial).addr << 0x10);
      std::operator<<(poVar5,");\n");
    }
  }
  poVar5 = Output::operator<<(this->out,(char (*) [8])"var ret");
  pbVar6 = std::operator<<(poVar5,(this->moduleName).super_IString.str);
  poVar5 = std::operator<<(pbVar6," = ");
  seenModules._M_h._M_single_bucket = (__node_base_ptr)(this->moduleName).super_IString.str._M_len;
  pbVar6 = std::operator<<(poVar5,(this->moduleName).super_IString.str);
  std::operator<<(pbVar6,"({\n");
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)local_80);
  visitor.this = (Wasm2JSGlue *)local_80;
  visitor.seenModules =
       (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
        *)this;
  ModuleUtils::iterImportedFunctions<wasm::Wasm2JSGlue::emitPostES6()::__0>
            ((ModuleUtils *)this->wasm,(Module *)local_80,visitor);
  ModuleUtils::iterImportedMemories<wasm::Wasm2JSGlue::emitPostES6()::__1>
            (this->wasm,(anon_class_8_1_8991fb9c)this);
  wasm = (Module *)local_80;
  visitor_00.this = (Wasm2JSGlue *)wasm;
  visitor_00.seenModules =
       (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
        *)this;
  ModuleUtils::iterImportedTables<wasm::Wasm2JSGlue::emitPostES6()::__2>
            ((ModuleUtils *)this->wasm,wasm,visitor_00);
  Output::operator<<(this->out,(char (*) [5])"});\n");
  if (((this->flags).allowAsserts & 1U) == 0) {
    this_00 = this->wasm;
    __end1 = std::
             vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ::begin(&this_00->exports);
    exp = (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
          std::
          vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
          ::end(&this_00->exports);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                                       *)&exp), bVar2) {
      this_01 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                ::operator*(&__end1);
      pEVar7 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         (this_01);
      EVar1 = pEVar7->kind;
      if ((EVar1 == Function) || (EVar1 == Memory || EVar1 == Global)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range2);
        __begin2 = (const_iterator)
                   std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                             (this_01);
        __end2 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                           ((basic_string_view<char,_std::char_traits<char>_> *)__begin2);
        pvStack_270 = std::basic_string_view<char,_std::char_traits<char>_>::end
                                ((basic_string_view<char,_std::char_traits<char>_> *)__begin2);
        for (; __end2 != pvStack_270; __end2 = __end2 + 1) {
          local_271 = *__end2;
          if (local_271 == '-') {
            std::operator<<((ostream *)&__range2,'_');
          }
          else {
            std::operator<<((ostream *)&__range2,local_271);
          }
        }
        poVar5 = Output::operator<<(this->out,(char (*) [12])"export var ");
        pEVar7 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                           (this_01);
        IString::toString_abi_cxx11_(&local_2b8,(IString *)pEVar7);
        ::wasm::asmangle(local_298,&local_2b8);
        poVar5 = std::operator<<(poVar5,local_298);
        poVar5 = std::operator<<(poVar5," = ret");
        local_2c8 = (ostream *)(this->moduleName).super_IString.str._M_len;
        pcStack_2c0 = (this->moduleName).super_IString.str._M_str;
        name.super_IString.str._M_str = (char *)wasm;
        name.super_IString.str._M_len = (size_t)pcStack_2c0;
        poVar5 = wasm::operator<<((wasm *)poVar5,local_2c8,name);
        poVar5 = std::operator<<(poVar5,".");
        pEVar7 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                           (this_01);
        IString::toString_abi_cxx11_(&local_308,(IString *)pEVar7);
        ::wasm::asmangle(local_2e8,&local_308);
        poVar5 = std::operator<<(poVar5,local_2e8);
        std::operator<<(poVar5,";\n");
        std::__cxx11::string::~string(local_2e8);
        std::__cxx11::string::~string((string *)&local_308);
        std::__cxx11::string::~string(local_298);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range2);
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
      ::operator++(&__end1);
    }
  }
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                    *)local_80);
  return;
}

Assistant:

void Wasm2JSGlue::emitPostES6() {
  // Create an initial `ArrayBuffer` and populate it with static data.
  // Currently we use base64 encoding to encode static data and we decode it at
  // instantiation time.
  //
  // Note that the translation here expects that the lower values of this memory
  // can be used for conversions, so make sure there's at least one page.
  if (!wasm.memories.empty() && wasm.memories[0]->imported()) {
    out << "var mem" << moduleName.str << " = new ArrayBuffer("
        << wasm.memories[0]->initial.addr * Memory::kPageSize << ");\n";
  }

  // Actually invoke the `asmFunc` generated function, passing in all global
  // values followed by all imports
  out << "var ret" << moduleName.str << " = " << moduleName.str << "({\n";

  std::unordered_set<Name> seenModules;

  ModuleUtils::iterImportedFunctions(wasm, [&](Function* import) {
    // The special helpers are emitted in the glue, see code and comments
    // below.
    if (ABI::wasm2js::isHelper(import->base)) {
      return;
    }
    if (seenModules.count(import->module) > 0) {
      return;
    }
    out << "  \"" << import->module
        << "\": " << asmangle(import->module.toString()) << ",\n";
    seenModules.insert(import->module);
  });

  ModuleUtils::iterImportedMemories(wasm, [&](Memory* import) {
    // The special helpers are emitted in the glue, see code and comments
    // below.
    if (ABI::wasm2js::isHelper(import->base)) {
      return;
    }
    out << "  \"" << import->module << "\": {\n";
    out << "    " << asmangle(import->base.toString()) << ": { buffer : mem"
        << moduleName.str << " }\n";
    out << "  },\n";
  });

  ModuleUtils::iterImportedTables(wasm, [&](Table* import) {
    // The special helpers are emitted in the glue, see code and comments
    // below.
    if (ABI::wasm2js::isHelper(import->base)) {
      return;
    }
    if (seenModules.count(import->module) > 0) {
      return;
    }
    out << "  \"" << import->module
        << "\": " << asmangle(import->module.toString()) << ",\n";
    seenModules.insert(import->module);
  });

  out << "});\n";

  if (flags.allowAsserts) {
    return;
  }

  // And now that we have our returned instance, export all our functions
  // that are hanging off it.
  for (auto& exp : wasm.exports) {
    switch (exp->kind) {
      case ExternalKind::Function:
      case ExternalKind::Global:
      case ExternalKind::Memory:
        break;

      // Exported globals and function tables aren't supported yet
      default:
        continue;
    }
    std::ostringstream export_name;
    for (char c : exp->name.str) {
      if (c == '-') {
        export_name << '_';
      } else {
        export_name << c;
      }
    }
    out << "export var " << asmangle(exp->name.toString()) << " = ret"
        << moduleName << "." << asmangle(exp->name.toString()) << ";\n";
  }
}